

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall gimage::Histogram::visualize(Histogram *this,ImageU8 *image,unsigned_long maxval)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  size_t __n;
  long lVar6;
  bool bVar7;
  
  if ((long)this->h < 2) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(image,(long)this->w,0x100,1);
    sVar1 = image->n;
    __n = -sVar1;
    if (0 < (long)sVar1) {
      __n = sVar1;
    }
    memset(image->pixel,0,__n);
    iVar4 = this->w;
    if (0 < iVar4) {
      lVar3 = 0;
      do {
        uVar5 = 0xff - (int)((this->val[lVar3] * 0xff) / maxval);
        if (-1 < (int)uVar5) {
          uVar2 = (ulong)uVar5;
          do {
            (*image->img)[uVar2][lVar3] = 0xff;
            bVar7 = uVar2 != 0;
            uVar2 = uVar2 - 1;
          } while (bVar7);
          iVar4 = this->w;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar4);
    }
  }
  else {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(long)this->w,(long)this->h,1);
    iVar4 = this->h;
    if (0 < iVar4) {
      uVar2 = (ulong)(uint)this->w;
      lVar3 = 0;
      do {
        if (0 < (int)uVar2) {
          lVar6 = 0;
          do {
            (*image->img)[lVar3][lVar6] = ~(byte)((this->row[lVar3][lVar6] * 0xff) / maxval);
            lVar6 = lVar6 + 1;
            uVar2 = (ulong)this->w;
          } while (lVar6 < (long)uVar2);
          iVar4 = this->h;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar4);
    }
  }
  return;
}

Assistant:

void Histogram::visualize(ImageU8 &image, unsigned long maxval) const
{
  if (h > 1)
  {
    image.setSize(w, h, 1);

    for (int k=0; k<h; k++)
    {
      for (int i=0; i<w; i++)
      {
        image.set(i, k, 0, static_cast<unsigned char>(255-255*row[k][i]/maxval));
      }
    }
  }
  else
  {
    image.setSize(w, 256, 1);
    image.clear();

    for (int i=0; i<w; i++)
    {
      int k=255-255*val[i]/maxval;

      while (k >= 0)
      {
        image.set(i, k--, 0, 255);
      }
    }
  }
}